

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACInfoWnd.cpp
# Opt level: O0

ImGuiWindowFlags_ __thiscall ACIWnd::beforeBegin(ACIWnd *this)

{
  bool bVar1;
  uint uVar2;
  ImGuiStyle *pIVar3;
  undefined8 in_RDI;
  ImVec2 IVar4;
  double dVar5;
  WndRect WVar6;
  ImVec4 IVar7;
  ImGuiStyle *style;
  float in_stack_ffffffffffffff90;
  float in_stack_ffffffffffffff94;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  LTImgWindow *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined8 local_38;
  WndPos local_28;
  WndPos local_20;
  float local_18;
  float local_10;
  
  uVar2 = std::isnan((double)(ulong)(uint)ACI_LABEL_SIZE);
  if ((uVar2 & 1) != 0) {
    ImGui::SetWindowFontScale(in_stack_ffffffffffffff94);
    in_stack_ffffffffffffffa0 = 0;
    in_stack_ffffffffffffff98 = 0;
    in_stack_ffffffffffffffa4 = 0xbf800000;
    IVar4 = ImGui::CalcTextSize(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                SUB81((ulong)in_RDI >> 0x38,0),(float)in_RDI);
    local_10 = IVar4.x;
    in_stack_ffffffffffffff94 = 10.0;
    dVar5 = std::ceil((double)(ulong)(uint)(local_10 / 10.0));
    ACI_LABEL_SIZE = SUB84(dVar5,0) * in_stack_ffffffffffffff94;
    IVar4 = ImGui::CalcTextSize(in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                                SUB81((ulong)in_RDI >> 0x38,0),(float)in_RDI);
    local_18 = IVar4.x;
    dVar5 = std::ceil((double)(ulong)(uint)(local_18 / 10.0));
    ACI_AUTO_CB_SIZE = SUB84(dVar5,0) * 10.0;
  }
  bVar1 = ImgWindow::IsPoppedOut((ImgWindow *)0x11f08b);
  if (!bVar1) {
    WVar6 = LTImgWindow::GetCurrentWindowGeometry(in_stack_ffffffffffffffb0);
    local_28 = WVar6.tl;
    dataRefs.ACIrect.tl = local_28;
    local_20 = WVar6.br;
    dataRefs.ACIrect.br = local_20;
  }
  pIVar3 = ImGui::GetStyle();
  ImColor::ImColor((ImColor *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                   (float)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                   in_stack_ffffffffffffff90);
  IVar7 = ImColor::operator_cast_to_ImVec4((ImColor *)&stack0xffffffffffffffb0);
  local_40 = IVar7._0_8_;
  pIVar3->Colors[2].x = (float)(undefined4)local_40;
  pIVar3->Colors[2].y = (float)local_40._4_4_;
  local_38 = IVar7._8_8_;
  pIVar3->Colors[2].z = (float)(undefined4)local_38;
  pIVar3->Colors[2].w = (float)local_38._4_4_;
  return ImGuiWindowFlags_NoSavedSettings;
}

Assistant:

ImGuiWindowFlags_ ACIWnd::beforeBegin()
{
    // If not yet done calculate some common widths
    if (std::isnan(ACI_LABEL_SIZE)) {
        /// Size of longest text plus some room for tree indenttion, rounded up to the next 10
        ImGui::SetWindowFontScale(1.0f);
        ACI_LABEL_SIZE   = std::ceil(ImGui::CalcTextSize("___Heading | Pitch | Roll_").x / 10.0f) * 10.0f;
        ACI_AUTO_CB_SIZE = std::ceil(ImGui::CalcTextSize("_____AUTO").x / 10.0f) * 10.0f;
    }
    
    // Save latest screen size to configuration (if not popped out)
    if (!IsPoppedOut())
        dataRefs.ACIrect = GetCurrentWindowGeometry();
    
    // Set background opacity
    ImGuiStyle& style = ImGui::GetStyle();
    style.Colors[ImGuiCol_WindowBg] =  ImColor(0.0f, 0.0f, 0.0f, float(dataRefs.UIopacity)/100.0f);
    
    // For A/C Info Window we don't store any settings in imgui.ini
    // because we can open multiple windows which all get different random ids, which collect over time
    return ImGuiWindowFlags_NoSavedSettings;
}